

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

PointerType __thiscall
cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->(iterator *this)

{
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar1;
  pointer pBVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0x4c,
                  "PointerType cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmStateDetail::BuildsystemDirectoryStateType]"
                 );
  }
  pBVar2 = (pcVar1->Data).
           super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(pcVar1->Data).
                super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 9;
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != uVar4) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0x4d,
                  "PointerType cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmStateDetail::BuildsystemDirectoryStateType]"
                 );
  }
  uVar3 = this->Position;
  if (uVar4 < uVar3) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0x4e,
                  "PointerType cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmStateDetail::BuildsystemDirectoryStateType]"
                 );
  }
  if (uVar3 != 0) {
    return pBVar2 + uVar3 + 0xffffffffffffffff;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                ,0x4f,
                "PointerType cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->() [T = cmStateDetail::BuildsystemDirectoryStateType]"
               );
}

Assistant:

PointerType operator->()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetPointer(this->Position - 1);
    }